

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

google * __thiscall google::DescribeOneFlag_abi_cxx11_(google *this,CommandLineFlagInfo *flag)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  allocator local_169;
  string local_168 [32];
  google local_148 [39];
  allocator local_121;
  string local_120 [32];
  google local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [39];
  allocator local_91;
  string local_90 [32];
  int local_70;
  int local_6c;
  int whitespace;
  int n;
  char *newline;
  allocator local_56;
  undefined1 local_55;
  int chars_in_line;
  int iStack_50;
  int chars_left;
  char *c_string;
  string local_38 [8];
  string main_part;
  CommandLineFlagInfo *flag_local;
  string *final_string;
  
  std::__cxx11::string::string(local_38);
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::c_str();
  SStringPrintf((string *)local_38,"    -%s (%s)",uVar3,uVar4);
  _iStack_50 = (char *)std::__cxx11::string::c_str();
  chars_in_line = std::__cxx11::string::length();
  local_55 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_56);
  std::allocator<char>::~allocator((allocator<char> *)&local_56);
  newline._4_4_ = 0;
  while( true ) {
    sVar5 = (size_t)chars_in_line;
    sVar6 = strlen(_iStack_50);
    if (sVar5 != sVar6) {
      __assert_fail("chars_left == strlen(c_string)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags_reporting.cc"
                    ,0x81,"string google::DescribeOneFlag(const CommandLineFlagInfo &)");
    }
    _whitespace = strchr(_iStack_50,10);
    if ((_whitespace == (char *)0x0) && (newline._4_4_ + chars_in_line < 0x50)) break;
    if ((_whitespace == (char *)0x0) ||
       ((long)(0x50 - newline._4_4_) <= (long)_whitespace - (long)_iStack_50)) {
      local_70 = 0x4f - newline._4_4_;
      while( true ) {
        bVar8 = false;
        if (0 < local_70) {
          iVar2 = isspace((int)_iStack_50[local_70]);
          bVar8 = iVar2 == 0;
        }
        pcVar1 = _iStack_50;
        if (!bVar8) break;
        local_70 = local_70 + -1;
      }
      if (local_70 < 1) {
        std::__cxx11::string::operator+=((string *)this,_iStack_50);
        newline._4_4_ = 0x50;
        goto LAB_00290e22;
      }
      uVar7 = (ulong)local_70;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,pcVar1,uVar7,&local_91);
      std::__cxx11::string::operator+=((string *)this,local_90);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      newline._4_4_ = local_70 + newline._4_4_;
      while (iVar2 = isspace((int)_iStack_50[local_70]), iVar2 != 0) {
        local_70 = local_70 + 1;
      }
      _iStack_50 = _iStack_50 + local_70;
      chars_in_line = chars_in_line - local_70;
    }
    else {
      local_6c = whitespace - iStack_50;
      std::__cxx11::string::append((char *)this,(ulong)_iStack_50);
      chars_in_line = chars_in_line - (local_6c + 1);
      _iStack_50 = _iStack_50 + (local_6c + 1);
    }
    if (*_iStack_50 == '\0') goto LAB_00290e22;
    StringAppendF((string *)this,"\n      ");
    newline._4_4_ = 6;
  }
  std::__cxx11::string::operator+=((string *)this,_iStack_50);
  newline._4_4_ = chars_in_line + newline._4_4_;
LAB_00290e22:
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"type: ",&local_d9);
  std::operator+(local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d8);
  AddString(local_b8,(string *)this,(int *)((long)&newline + 4));
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"default",&local_121);
  PrintStringFlagsWithQuotes(local_100,flag,(string *)local_120,false);
  AddString((string *)local_100,(string *)this,(int *)((long)&newline + 4));
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  if ((flag->is_default & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_168,"currently",&local_169);
    PrintStringFlagsWithQuotes(local_148,flag,(string *)local_168,true);
    AddString((string *)local_148,(string *)this,(int *)((long)&newline + 4));
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  StringAppendF((string *)this,"\n");
  local_55 = 1;
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

string DescribeOneFlag(const CommandLineFlagInfo& flag) {
  string main_part;
  SStringPrintf(&main_part, "    -%s (%s)",
                flag.name.c_str(),
                flag.description.c_str());
  const char* c_string = main_part.c_str();
  int chars_left = static_cast<int>(main_part.length());
  string final_string = "";
  int chars_in_line = 0;  // how many chars in current line so far?
  while (1) {
    assert(chars_left == strlen(c_string));  // Unless there's a \0 in there?
    const char* newline = strchr(c_string, '\n');
    if (newline == NULL && chars_in_line+chars_left < kLineLength) {
      // The whole remainder of the string fits on this line
      final_string += c_string;
      chars_in_line += chars_left;
      break;
    }
    if (newline != NULL && newline - c_string < kLineLength - chars_in_line) {
      int n = static_cast<int>(newline - c_string);
      final_string.append(c_string, n);
      chars_left -= n + 1;
      c_string += n + 1;
    } else {
      // Find the last whitespace on this 80-char line
      int whitespace = kLineLength-chars_in_line-1;  // < 80 chars/line
      while ( whitespace > 0 && !isspace(c_string[whitespace]) ) {
        --whitespace;
      }
      if (whitespace <= 0) {
        // Couldn't find any whitespace to make a line break.  Just dump the
        // rest out!
        final_string += c_string;
        chars_in_line = kLineLength;  // next part gets its own line for sure!
        break;
      }
      final_string += string(c_string, whitespace);
      chars_in_line += whitespace;
      while (isspace(c_string[whitespace]))  ++whitespace;
      c_string += whitespace;
      chars_left -= whitespace;
    }
    if (*c_string == '\0')
      break;
    StringAppendF(&final_string, "\n      ");
    chars_in_line = 6;
  }

  // Append data type
  AddString(string("type: ") + flag.type, &final_string, &chars_in_line);
  // The listed default value will be the actual default from the flag
  // definition in the originating source file, unless the value has
  // subsequently been modified using SetCommandLineOptionWithMode() with mode
  // SET_FLAGS_DEFAULT, or by setting FLAGS_foo = bar before ParseCommandLineFlags().
  AddString(PrintStringFlagsWithQuotes(flag, "default", false), &final_string,
            &chars_in_line);
  if (!flag.is_default) {
    AddString(PrintStringFlagsWithQuotes(flag, "currently", true),
              &final_string, &chars_in_line);
  }

  StringAppendF(&final_string, "\n");
  return final_string;
}